

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O1

bool __thiscall CCoinsViewDB::NeedsUpgrade(CCoinsViewDB *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> cursor;
  __uniq_ptr_impl<CDBIterator,_std::default_delete<CDBIterator>_> local_40;
  pair<unsigned_char,_uint256> local_31;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_t.super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
  super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl =
       (tuple<CDBIterator_*,_std::default_delete<CDBIterator>_>)
       CDBWrapper::NewIterator
                 ((this->m_db)._M_t.
                  super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
                  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl);
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_31.second.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_31.first = 'c';
  CDBIterator::Seek<std::pair<unsigned_char,uint256>>
            ((CDBIterator *)
             local_40._M_t.super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>.
             super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl,&local_31);
  bVar1 = CDBIterator::Valid((CDBIterator *)
                             local_40._M_t.
                             super__Tuple_impl<0UL,_CDBIterator_*,_std::default_delete<CDBIterator>_>
                             .super__Head_base<0UL,_CDBIterator_*,_false>._M_head_impl);
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewDB::NeedsUpgrade()
{
    std::unique_ptr<CDBIterator> cursor{m_db->NewIterator()};
    // DB_COINS was deprecated in v0.15.0, commit
    // 1088b02f0ccd7358d2b7076bb9e122d59d502d02
    cursor->Seek(std::make_pair(DB_COINS, uint256{}));
    return cursor->Valid();
}